

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

void If_CutPrintTiming(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  If_Cut_t *pIVar2;
  bool bVar3;
  uint local_24;
  If_Obj_t *pIStack_20;
  uint i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  Abc_Print(1,"{");
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < *(uint *)&pCut->field_0x1c >> 0x18) {
      pIStack_20 = If_ManObj(p,(int)(&pCut[1].Area)[local_24]);
      bVar3 = pIStack_20 != (If_Obj_t *)0x0;
    }
    if (!bVar3) break;
    uVar1 = pIStack_20->Id;
    pIVar2 = If_ObjCutBest(pIStack_20);
    Abc_Print(1," %d(%.2f/%.2f)",(double)pIVar2->Delay,(double)pIStack_20->Required,(ulong)uVar1);
    local_24 = local_24 + 1;
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrintTiming( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    unsigned i;
    Abc_Print( 1, "{" );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        Abc_Print( 1, " %d(%.2f/%.2f)", pLeaf->Id, If_ObjCutBest(pLeaf)->Delay, pLeaf->Required );
    Abc_Print( 1, " }\n" );
}